

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

longlong __thiscall mkvparser::Segment::ParseHeaders(Segment *this)

{
  int iVar1;
  longlong lVar2;
  SeekHead *this_00;
  long lVar3;
  long element_size_00;
  SegmentInfo *this_01;
  long lVar4;
  Tracks *this_02;
  Tags *this_03;
  Segment *in_RDI;
  long status_5;
  long status_4;
  long status_3;
  long status_2;
  long status_1;
  longlong element_size;
  longlong size;
  longlong id;
  longlong idpos;
  longlong result;
  long len;
  unsigned_long_long rollover_check;
  longlong element_start;
  longlong pos;
  longlong segment_stop;
  int status;
  longlong available;
  longlong total;
  Tags *in_stack_fffffffffffffe88;
  Chapters *in_stack_fffffffffffffe90;
  Chapters *in_stack_fffffffffffffe98;
  SeekHead *in_stack_fffffffffffffea0;
  SeekHead *in_stack_fffffffffffffea8;
  Cues *in_stack_fffffffffffffeb0;
  Cues *in_stack_fffffffffffffeb8;
  Tracks *local_138;
  SegmentInfo *this_04;
  long local_120;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffeff;
  long local_50;
  long local_20;
  long local_18 [2];
  long local_8;
  
  iVar1 = (*in_RDI->m_pReader->_vptr_IMkvReader[1])(in_RDI->m_pReader,local_18,&local_20);
  if (iVar1 < 0) {
    local_8 = (long)iVar1;
  }
  else if ((local_18[0] < 1) || (local_20 <= local_18[0])) {
    if (in_RDI->m_size < 0) {
      local_120 = -1;
    }
    else {
      local_120 = in_RDI->m_start + in_RDI->m_size;
    }
    if ((((local_120 < 0) || (local_18[0] < 0)) || (local_120 <= local_18[0])) &&
       ((local_120 < 0 || (in_RDI->m_pos <= local_120)))) {
      while (((local_18[0] < 0 || (in_RDI->m_pos < local_18[0])) &&
             ((local_120 < 0 || (in_RDI->m_pos < local_120))))) {
        lVar4 = in_RDI->m_pos;
        if (0x7fffffffffffffff < lVar4 + 1U) {
          return -2;
        }
        if (local_20 < lVar4 + 1) {
          return lVar4 + 1;
        }
        lVar2 = GetUIntLength((IMkvReader *)in_stack_fffffffffffffe98,
                              (longlong)in_stack_fffffffffffffe90,(long *)in_stack_fffffffffffffe88)
        ;
        if (lVar2 < 0) {
          return lVar2;
        }
        if (0 < lVar2) {
          return lVar4 + 1;
        }
        if ((-1 < local_120) && (local_120 < lVar4 + local_50)) {
          return -2;
        }
        if (local_20 < lVar4 + local_50) {
          return lVar4 + local_50;
        }
        this_00 = (SeekHead *)
                  ReadID((IMkvReader *)in_stack_fffffffffffffeb8,(longlong)in_stack_fffffffffffffeb0
                         ,(long *)in_stack_fffffffffffffea8);
        if ((long)this_00 < 0) {
          return -2;
        }
        if (this_00 == (SeekHead *)0x1f43b675) break;
        lVar3 = local_50 + lVar4;
        if (local_20 < lVar3 + 1) {
          return lVar3 + 1;
        }
        lVar2 = GetUIntLength((IMkvReader *)in_stack_fffffffffffffe98,
                              (longlong)in_stack_fffffffffffffe90,(long *)in_stack_fffffffffffffe88)
        ;
        if (lVar2 < 0) {
          return lVar2;
        }
        if (0 < lVar2) {
          return lVar3 + 1;
        }
        if ((-1 < local_120) && (local_120 < lVar3 + local_50)) {
          return -2;
        }
        if (local_20 < lVar3 + local_50) {
          return lVar3 + local_50;
        }
        lVar2 = ReadUInt((IMkvReader *)in_stack_fffffffffffffea8,(longlong)in_stack_fffffffffffffea0
                         ,(long *)in_stack_fffffffffffffe98);
        if (lVar2 < 0) {
          return lVar2;
        }
        if (local_50 < 1) {
          return lVar2;
        }
        if (8 < local_50) {
          return lVar2;
        }
        lVar3 = local_50 + lVar3;
        if (0x7fffffffffffffff < (ulong)(lVar3 + lVar2)) {
          return -2;
        }
        element_size_00 = (lVar2 + lVar3) - lVar4;
        if ((-1 < local_120) && (local_120 < lVar3 + lVar2)) {
          return -2;
        }
        if (local_20 < lVar3 + lVar2) {
          return lVar3 + lVar2;
        }
        if (this_00 == (SeekHead *)0x1549a966) {
          if (in_RDI->m_pInfo != (SegmentInfo *)0x0) {
            return -2;
          }
          this_01 = (SegmentInfo *)operator_new(0x50,(nothrow_t *)&std::nothrow);
          this_04 = (SegmentInfo *)0x0;
          if (this_01 != (SegmentInfo *)0x0) {
            SegmentInfo::SegmentInfo(this_01,in_RDI,lVar3,lVar2,lVar4,element_size_00);
            this_04 = this_01;
          }
          in_RDI->m_pInfo = this_04;
          if (in_RDI->m_pInfo == (SegmentInfo *)0x0) {
            return -1;
          }
          lVar4 = SegmentInfo::Parse(this_04);
joined_r0x00191d59:
          if (lVar4 != 0) {
            return lVar4;
          }
        }
        else {
          if (this_00 == (SeekHead *)0x1654ae6b) {
            if (in_RDI->m_pTracks != (Tracks *)0x0) {
              return -2;
            }
            this_02 = (Tracks *)operator_new(0x38,(nothrow_t *)&std::nothrow);
            local_138 = (Tracks *)0x0;
            if (this_02 != (Tracks *)0x0) {
              Tracks::Tracks(this_02,in_RDI,lVar3,lVar2,lVar4,element_size_00);
              local_138 = this_02;
            }
            in_RDI->m_pTracks = local_138;
            if (in_RDI->m_pTracks == (Tracks *)0x0) {
              return -1;
            }
            lVar4 = Tracks::Parse((Tracks *)
                                  CONCAT17(in_stack_fffffffffffffeff,in_stack_fffffffffffffef8));
            goto joined_r0x00191d59;
          }
          if (this_00 == (SeekHead *)0x1c53bb6b) {
            if (in_RDI->m_pCues == (Cues *)0x0) {
              in_stack_fffffffffffffeb0 = (Cues *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              in_stack_fffffffffffffeb8 = (Cues *)0x0;
              if (in_stack_fffffffffffffeb0 != (Cues *)0x0) {
                Cues::Cues(in_stack_fffffffffffffeb0,in_RDI,lVar3,lVar2,lVar4,element_size_00);
                in_stack_fffffffffffffeb8 = in_stack_fffffffffffffeb0;
              }
              in_RDI->m_pCues = in_stack_fffffffffffffeb8;
              if (in_RDI->m_pCues == (Cues *)0x0) {
                return -1;
              }
            }
          }
          else if (this_00 == (SeekHead *)0x114d9b74) {
            if (in_RDI->m_pSeekHead == (SeekHead *)0x0) {
              in_stack_fffffffffffffea0 = (SeekHead *)operator_new(0x48,(nothrow_t *)&std::nothrow);
              in_stack_fffffffffffffea8 = (SeekHead *)0x0;
              if (in_stack_fffffffffffffea0 != (SeekHead *)0x0) {
                SeekHead::SeekHead(in_stack_fffffffffffffea0,in_RDI,lVar3,lVar2,lVar4,
                                   element_size_00);
                in_stack_fffffffffffffea8 = in_stack_fffffffffffffea0;
              }
              in_RDI->m_pSeekHead = in_stack_fffffffffffffea8;
              if (in_RDI->m_pSeekHead == (SeekHead *)0x0) {
                return -1;
              }
              lVar4 = SeekHead::Parse(this_00);
              goto joined_r0x00191d59;
            }
          }
          else if (this_00 == (SeekHead *)0x1043a770) {
            if (in_RDI->m_pChapters == (Chapters *)0x0) {
              in_stack_fffffffffffffe90 = (Chapters *)operator_new(0x38,(nothrow_t *)&std::nothrow);
              in_stack_fffffffffffffe98 = (Chapters *)0x0;
              if (in_stack_fffffffffffffe90 != (Chapters *)0x0) {
                Chapters::Chapters(in_stack_fffffffffffffe90,in_RDI,lVar3,lVar2,lVar4,
                                   element_size_00);
                in_stack_fffffffffffffe98 = in_stack_fffffffffffffe90;
              }
              in_RDI->m_pChapters = in_stack_fffffffffffffe98;
              if (in_RDI->m_pChapters == (Chapters *)0x0) {
                return -1;
              }
              lVar4 = Chapters::Parse((Chapters *)in_stack_fffffffffffffea8);
              goto joined_r0x00191d59;
            }
          }
          else if ((this_00 == (SeekHead *)0x1254c367) && (in_RDI->m_pTags == (Tags *)0x0)) {
            this_03 = (Tags *)operator_new(0x38,(nothrow_t *)&std::nothrow);
            in_stack_fffffffffffffeff = 0;
            in_stack_fffffffffffffe88 = (Tags *)0x0;
            if (this_03 != (Tags *)0x0) {
              in_stack_fffffffffffffeff = 1;
              Tags::Tags(this_03,in_RDI,lVar3,lVar2,lVar4,element_size_00);
              in_stack_fffffffffffffe88 = this_03;
            }
            in_RDI->m_pTags = in_stack_fffffffffffffe88;
            if (in_RDI->m_pTags == (Tags *)0x0) {
              return -1;
            }
            lVar4 = Tags::Parse((Tags *)in_stack_fffffffffffffea8);
            goto joined_r0x00191d59;
          }
        }
        in_RDI->m_pos = lVar3 + lVar2;
      }
      if ((local_120 < 0) || (in_RDI->m_pos <= local_120)) {
        if (in_RDI->m_pInfo == (SegmentInfo *)0x0) {
          local_8 = -2;
        }
        else if (in_RDI->m_pTracks == (Tracks *)0x0) {
          local_8 = -2;
        }
        else {
          local_8 = 0;
        }
      }
      else {
        local_8 = -2;
      }
    }
    else {
      local_8 = -2;
    }
  }
  else {
    local_8 = -2;
  }
  return local_8;
}

Assistant:

long long Segment::ParseHeaders() {
  // Outermost (level 0) segment object has been constructed,
  // and pos designates start of payload.  We need to find the
  // inner (level 1) elements.
  long long total, available;

  const int status = m_pReader->Length(&total, &available);

  if (status < 0)  // error
    return status;

  if (total > 0 && available > total)
    return E_FILE_FORMAT_INVALID;

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  if ((segment_stop >= 0 && total >= 0 && segment_stop > total) ||
      (segment_stop >= 0 && m_pos > segment_stop)) {
    return E_FILE_FORMAT_INVALID;
  }

  for (;;) {
    if ((total >= 0) && (m_pos >= total))
      break;

    if ((segment_stop >= 0) && (m_pos >= segment_stop))
      break;

    long long pos = m_pos;
    const long long element_start = pos;

    // Avoid rolling over pos when very close to LLONG_MAX.
    unsigned long long rollover_check = pos + 1ULL;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    if ((pos + 1) > available)
      return (pos + 1);

    long len;
    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long idpos = pos;
    const long long id = ReadID(m_pReader, idpos, len);

    if (id < 0)
      return E_FILE_FORMAT_INVALID;

    if (id == libwebm::kMkvCluster)
      break;

    pos += len;  // consume ID

    if ((pos + 1) > available)
      return (pos + 1);

    // Read Size
    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return result;

    if (result > 0) {
      // MkvReader doesn't have enough data to satisfy this read attempt.
      return (pos + 1);
    }

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > available)
      return pos + len;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0 || len < 1 || len > 8) {
      // TODO(tomfinegan): ReadUInt should return an error when len is < 1 or
      // len > 8 is true instead of checking this _everywhere_.
      return size;
    }

    pos += len;  // consume length of size of element

    // Avoid rolling over pos when very close to LLONG_MAX.
    rollover_check = static_cast<unsigned long long>(pos) + size;
    if (rollover_check > LLONG_MAX)
      return E_FILE_FORMAT_INVALID;

    const long long element_size = size + pos - element_start;

    // Pos now points to start of payload

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // We read EBML elements either in total or nothing at all.

    if ((pos + size) > available)
      return pos + size;

    if (id == libwebm::kMkvInfo) {
      if (m_pInfo)
        return E_FILE_FORMAT_INVALID;

      m_pInfo = new (std::nothrow)
          SegmentInfo(this, pos, size, element_start, element_size);

      if (m_pInfo == NULL)
        return -1;

      const long status = m_pInfo->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvTracks) {
      if (m_pTracks)
        return E_FILE_FORMAT_INVALID;

      m_pTracks = new (std::nothrow)
          Tracks(this, pos, size, element_start, element_size);

      if (m_pTracks == NULL)
        return -1;

      const long status = m_pTracks->Parse();

      if (status)
        return status;
    } else if (id == libwebm::kMkvCues) {
      if (m_pCues == NULL) {
        m_pCues = new (std::nothrow)
            Cues(this, pos, size, element_start, element_size);

        if (m_pCues == NULL)
          return -1;
      }
    } else if (id == libwebm::kMkvSeekHead) {
      if (m_pSeekHead == NULL) {
        m_pSeekHead = new (std::nothrow)
            SeekHead(this, pos, size, element_start, element_size);

        if (m_pSeekHead == NULL)
          return -1;

        const long status = m_pSeekHead->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvChapters) {
      if (m_pChapters == NULL) {
        m_pChapters = new (std::nothrow)
            Chapters(this, pos, size, element_start, element_size);

        if (m_pChapters == NULL)
          return -1;

        const long status = m_pChapters->Parse();

        if (status)
          return status;
      }
    } else if (id == libwebm::kMkvTags) {
      if (m_pTags == NULL) {
        m_pTags = new (std::nothrow)
            Tags(this, pos, size, element_start, element_size);

        if (m_pTags == NULL)
          return -1;

        const long status = m_pTags->Parse();

        if (status)
          return status;
      }
    }

    m_pos = pos + size;  // consume payload
  }

  if (segment_stop >= 0 && m_pos > segment_stop)
    return E_FILE_FORMAT_INVALID;

  if (m_pInfo == NULL)  // TODO: liberalize this behavior
    return E_FILE_FORMAT_INVALID;

  if (m_pTracks == NULL)
    return E_FILE_FORMAT_INVALID;

  return 0;  // success
}